

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int AllocateInternalBuffers8b(VP8LDecoder *dec)

{
  int iVar1;
  uint32_t *puVar2;
  VP8LDecoder *in_RDI;
  uint64_t total_num_pixels;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  in_RDI->argb_cache_ = (uint32_t *)0x0;
  puVar2 = (uint32_t *)
           WebPSafeMalloc(CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (size_t)in_RDI);
  in_RDI->pixels_ = puVar2;
  if (in_RDI->pixels_ == (uint32_t *)0x0) {
    iVar1 = VP8LSetError(in_RDI,VP8_STATUS_OUT_OF_MEMORY);
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int AllocateInternalBuffers8b(VP8LDecoder* const dec) {
  const uint64_t total_num_pixels = (uint64_t)dec->width_ * dec->height_;
  dec->argb_cache_ = NULL;    // for soundness
  dec->pixels_ = (uint32_t*)WebPSafeMalloc(total_num_pixels, sizeof(uint8_t));
  if (dec->pixels_ == NULL) {
    return VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
  }
  return 1;
}